

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

logical pnga_update55_ghosts(Integer g_a)

{
  long lVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  C_Integer *pCVar10;
  int *piVar11;
  double dVar12;
  global_array_t *pgVar13;
  int _d;
  int iVar14;
  Integer proc;
  logical lVar15;
  Integer *map;
  Integer *proclist;
  size_t sVar16;
  Integer IVar17;
  Integer IVar18;
  int iVar19;
  logical lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  C_Integer CVar29;
  Integer _last_1;
  long lVar30;
  long lVar31;
  Integer idx;
  int iVar32;
  Integer _last;
  int _ndim;
  long lVar33;
  ulong uVar34;
  long ndim;
  int local_630;
  int local_620;
  int _index [7];
  Integer _hi [7];
  int stride_rem [7];
  int stride_loc [7];
  int count [7];
  Integer np;
  Integer plo_rem [7];
  char err_string [256];
  Integer width [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer phi_rem [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  Integer plo_loc [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer increment [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar15 = pnga_has_ghosts(g_a);
  lVar20 = 1;
  if (lVar15 != 0) {
    lVar1 = g_a + 1000;
    iVar4 = GA[lVar1].elemsize;
    sVar2 = GA[lVar1].ndim;
    ndim = (long)sVar2;
    iVar5 = GA[lVar1].p_handle;
    if (0 < ndim) {
      lVar21 = 0;
      do {
        increment[lVar21] = 0;
        width[lVar21] = GA[g_a + 1000].width[lVar21];
        dims[lVar21] = GA[g_a + 1000].dims[lVar21];
        if ((lo_loc[lVar21] == 0) && (hi_loc[lVar21] == -1)) goto LAB_00190f9b;
        lVar21 = lVar21 + 1;
      } while (ndim != lVar21);
    }
    lVar15 = gai_check_ghost_distr(g_a);
    if (lVar15 == 0) {
LAB_00190f9b:
      lVar20 = 0;
    }
    else {
      map = (Integer *)malloc(GAnproc * 0x70 | 8);
      if (map == (Integer *)0x0) {
        pnga_error("pnga_update55_ghosts:malloc failed (_ga_map)",0);
      }
      proclist = (Integer *)malloc(GAnproc << 3);
      if (proclist == (Integer *)0x0) {
        pnga_error("pnga_update55_ghosts:malloc failed (_ga_proclist)",0);
      }
      pnga_distribution(g_a,proc,lo_loc,hi_loc);
      *GA_Update_Signal = 1;
      if (0 < sVar2) {
        local_620 = (int)proc;
        lVar21 = ndim + -1;
        lVar22 = 1;
        if (1 < lVar21) {
          lVar22 = lVar21;
        }
        idx = 0;
        iVar32 = 0;
        do {
          lVar6 = width[idx];
          if (lVar6 != 0) {
            get_remote_block_neg(idx,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
            lVar15 = pnga_locate_region(g_a,slo_rem,shi_rem,map,proclist,&np);
            if (lVar15 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar16 = strlen(err_string);
              sprintf(err_string + (int)sVar16," [%ld:%ld ",slo_rem[0],shi_rem[0]);
              sVar16 = strlen(err_string);
              iVar19 = (int)sVar16;
              IVar17 = pnga_ndim(g_a);
              if (1 < IVar17) {
                lVar33 = 1;
                do {
                  sprintf(err_string + (int)sVar16,",%ld:%ld ",slo_rem[lVar33],shi_rem[lVar33]);
                  sVar16 = strlen(err_string);
                  iVar19 = (int)sVar16;
                  lVar33 = lVar33 + 1;
                  IVar17 = pnga_ndim(g_a);
                } while (lVar33 < IVar17);
              }
              (err_string + iVar19)[0] = ']';
              (err_string + iVar19)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            IVar17 = *proclist;
            pnga_distribution(g_a,IVar17,tlo_rem,thi_rem);
            pgVar13 = GA;
            lVar33 = 0;
            do {
              if (increment[lVar33] == 0) {
                if (idx == lVar33) {
                  lVar27 = width[lVar33];
                  plo_rem[lVar33] = lVar27 + (thi_rem[lVar33] - tlo_rem[lVar33]) + 1;
                  lVar23 = (thi_rem[lVar33] - tlo_rem[lVar33]) + lVar27 * 2;
                }
                else {
                  lVar27 = width[lVar33];
                  plo_rem[lVar33] = lVar27;
                  lVar23 = (thi_rem[lVar33] + lVar27) - tlo_rem[lVar33];
                }
              }
              else {
                plo_rem[lVar33] = 0;
                lVar23 = (increment[lVar33] + thi_rem[lVar33]) - tlo_rem[lVar33];
                lVar27 = 0;
              }
              phi_rem[lVar33] = lVar23;
              plo_loc[lVar33] = lVar27;
              lVar33 = lVar33 + 1;
            } while (ndim != lVar33);
            uVar3 = GA[lVar1].ndim;
            uVar34 = (ulong)(short)uVar3;
            iVar19 = GA[lVar1].distr_type;
            if (iVar19 - 1U < 3) {
              uVar26 = (long)local_620 % GA[lVar1].num_blocks[0];
              _index[0] = (int)uVar26;
              if (1 < (short)uVar3) {
                uVar26 = uVar26 & 0xffffffff;
                lVar33 = 0;
                IVar18 = proc;
                do {
                  IVar18 = (long)((int)IVar18 - (int)uVar26) / GA[g_a + 1000].num_blocks[lVar33];
                  uVar26 = (long)(int)IVar18 % GA[g_a + 1000].num_blocks[lVar33 + 1];
                  _index[lVar33 + 1] = (int)uVar26;
                  lVar33 = lVar33 + 1;
                } while ((uVar34 & 0xffffffff) - 1 != lVar33);
              }
              if (0 < (short)uVar3) {
                lVar33 = 0;
                do {
                  iVar25 = *(int *)((long)_index + lVar33);
                  lVar23 = *(long *)((long)GA[g_a + 1000].block_dims + lVar33 * 2);
                  *(long *)(err_string + lVar33 * 2) = lVar23 * iVar25 + 1;
                  lVar23 = ((long)iVar25 + 1) * lVar23;
                  *(long *)((long)_hi + lVar33 * 2) = lVar23;
                  lVar27 = *(long *)((long)GA[g_a + 1000].dims + lVar33 * 2);
                  if (lVar27 <= lVar23) {
                    lVar23 = lVar27;
                  }
                  *(long *)((long)_hi + lVar33 * 2) = lVar23;
                  lVar33 = lVar33 + 4;
                } while ((uVar34 & 0xffffffff) << 2 != lVar33);
              }
            }
            else if (iVar19 == 4) {
              uVar26 = (long)local_620 % GA[lVar1].num_blocks[0];
              _index[0] = (int)uVar26;
              if (1 < (short)uVar3) {
                uVar26 = uVar26 & 0xffffffff;
                lVar33 = 0;
                IVar18 = proc;
                do {
                  IVar18 = (long)((int)IVar18 - (int)uVar26) / GA[g_a + 1000].num_blocks[lVar33];
                  uVar26 = (long)(int)IVar18 % GA[g_a + 1000].num_blocks[lVar33 + 1];
                  _index[lVar33 + 1] = (int)uVar26;
                  lVar33 = lVar33 + 1;
                } while ((uVar34 & 0xffffffff) - 1 != lVar33);
              }
              if (0 < (short)uVar3) {
                pCVar10 = GA[lVar1].mapc;
                lVar33 = 0;
                iVar25 = 0;
                do {
                  iVar14 = *(int *)((long)_index + lVar33);
                  lVar23 = (long)iVar25 + (long)iVar14;
                  *(C_Integer *)(err_string + lVar33 * 2) = pCVar10[lVar23];
                  if ((long)iVar14 < *(long *)((long)GA[lVar1].num_blocks + lVar33 * 2) + -1) {
                    lVar23 = GA[lVar1].mapc[lVar23 + 1] + -1;
                  }
                  else {
                    lVar23 = *(long *)((long)GA[lVar1].dims + lVar33 * 2);
                  }
                  *(long *)((long)_hi + lVar33 * 2) = lVar23;
                  iVar25 = iVar25 + *(int *)((long)GA[lVar1].num_blocks + lVar33 * 2);
                  lVar33 = lVar33 + 4;
                } while ((uVar34 & 0xffffffff) << 2 != lVar33);
              }
            }
            else if (iVar19 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if ((short)uVar3 < 1) {
                  lVar33 = 1;
                }
                else {
                  lVar33 = 1;
                  uVar26 = 0;
                  do {
                    lVar33 = lVar33 * GA[g_a + 1000].nblock[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar34 != uVar26);
                }
                if ((-1 < proc) && (proc < lVar33)) {
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    uVar26 = 0;
                    lVar33 = 0;
                    IVar18 = proc;
                    do {
                      lVar27 = (long)GA[g_a + 1000].nblock[uVar26];
                      lVar23 = IVar18 % lVar27;
                      width[uVar26 - 0x20] = pCVar10[lVar23 + lVar33];
                      if (lVar23 == lVar27 + -1) {
                        CVar29 = GA[g_a + 1000].dims[uVar26];
                      }
                      else {
                        CVar29 = pCVar10[lVar23 + lVar33 + 1] + -1;
                      }
                      lVar33 = lVar33 + lVar27;
                      _hi[uVar26] = CVar29;
                      uVar26 = uVar26 + 1;
                      IVar18 = IVar18 / lVar27;
                    } while (uVar34 != uVar26);
                  }
                  goto LAB_0018fc47;
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                if ((short)uVar3 < 1) {
                  lVar33 = 1;
                }
                else {
                  lVar33 = 1;
                  uVar26 = 0;
                  do {
                    lVar33 = lVar33 * GA[g_a + 1000].nblock[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar34 != uVar26);
                }
                if ((-1 < proc) && (proc < lVar33)) {
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    uVar26 = 0;
                    lVar33 = 0;
                    IVar18 = proc;
                    do {
                      lVar27 = (long)GA[g_a + 1000].nblock[uVar26];
                      lVar23 = IVar18 % lVar27;
                      width[uVar26 - 0x20] = pCVar10[lVar23 + lVar33];
                      if (lVar23 == lVar27 + -1) {
                        CVar29 = GA[g_a + 1000].dims[uVar26];
                      }
                      else {
                        CVar29 = pCVar10[lVar23 + lVar33 + 1] + -1;
                      }
                      lVar33 = lVar33 + lVar27;
                      _hi[uVar26] = CVar29;
                      uVar26 = uVar26 + 1;
                      IVar18 = IVar18 / lVar27;
                    } while (uVar34 != uVar26);
                  }
                  goto LAB_0018fc47;
                }
              }
              if (0 < (short)uVar3) {
                memset(err_string,0,uVar34 * 8);
                memset(_hi,0xff,uVar34 * 8);
              }
            }
LAB_0018fc47:
            if (uVar34 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar13[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar23 = 1;
              lVar33 = 0;
            }
            else {
              lVar23 = 1;
              lVar27 = 0;
              lVar33 = 0;
              do {
                lVar33 = lVar33 + plo_loc[lVar27] * lVar23;
                lVar30 = (_hi[lVar27] - width[lVar27 + -0x20]) +
                         pgVar13[g_a + 1000].width[lVar27] * 2 + 1;
                ld_loc[lVar27] = lVar30;
                lVar23 = lVar23 * lVar30;
                lVar27 = lVar27 + 1;
              } while (uVar34 - 1 != lVar27);
            }
            lVar27 = plo_loc[uVar34 - 1];
            ppcVar7 = pgVar13[lVar1].ptr;
            iVar25 = pgVar13[lVar1].elemsize;
            pcVar8 = ppcVar7[proc];
            local_630 = (int)IVar17;
            if (iVar19 - 1U < 3) {
              uVar26 = (long)local_630 % pgVar13[lVar1].num_blocks[0];
              _index[0] = (int)uVar26;
              if (1 < (short)uVar3) {
                uVar26 = uVar26 & 0xffffffff;
                lVar30 = 0;
                IVar18 = IVar17;
                do {
                  IVar18 = (long)((int)IVar18 - (int)uVar26) /
                           pgVar13[g_a + 1000].num_blocks[lVar30];
                  uVar26 = (long)(int)IVar18 % pgVar13[g_a + 1000].num_blocks[lVar30 + 1];
                  _index[lVar30 + 1] = (int)uVar26;
                  lVar30 = lVar30 + 1;
                } while ((uVar34 & 0xffffffff) - 1 != lVar30);
              }
              if (0 < (short)uVar3) {
                lVar30 = 0;
                do {
                  iVar19 = *(int *)((long)_index + lVar30);
                  lVar28 = *(long *)((long)pgVar13[g_a + 1000].block_dims + lVar30 * 2);
                  *(long *)(err_string + lVar30 * 2) = lVar28 * iVar19 + 1;
                  lVar28 = ((long)iVar19 + 1) * lVar28;
                  *(long *)((long)_hi + lVar30 * 2) = lVar28;
                  lVar24 = *(long *)((long)pgVar13[g_a + 1000].dims + lVar30 * 2);
                  if (lVar24 <= lVar28) {
                    lVar28 = lVar24;
                  }
                  *(long *)((long)_hi + lVar30 * 2) = lVar28;
                  lVar30 = lVar30 + 4;
                } while ((uVar34 & 0xffffffff) << 2 != lVar30);
              }
            }
            else if (iVar19 == 4) {
              uVar26 = (long)local_630 % pgVar13[lVar1].num_blocks[0];
              _index[0] = (int)uVar26;
              if (1 < (short)uVar3) {
                uVar26 = uVar26 & 0xffffffff;
                lVar30 = 0;
                IVar18 = IVar17;
                do {
                  IVar18 = (long)((int)IVar18 - (int)uVar26) /
                           pgVar13[g_a + 1000].num_blocks[lVar30];
                  uVar26 = (long)(int)IVar18 % pgVar13[g_a + 1000].num_blocks[lVar30 + 1];
                  _index[lVar30 + 1] = (int)uVar26;
                  lVar30 = lVar30 + 1;
                } while ((uVar34 & 0xffffffff) - 1 != lVar30);
              }
              if (0 < (short)uVar3) {
                pCVar10 = pgVar13[lVar1].mapc;
                lVar30 = 0;
                iVar19 = 0;
                do {
                  iVar14 = *(int *)((long)_index + lVar30);
                  lVar28 = (long)iVar19 + (long)iVar14;
                  *(C_Integer *)(err_string + lVar30 * 2) = pCVar10[lVar28];
                  if ((long)iVar14 < *(long *)((long)pgVar13[lVar1].num_blocks + lVar30 * 2) + -1) {
                    lVar28 = pgVar13[lVar1].mapc[lVar28 + 1] + -1;
                  }
                  else {
                    lVar28 = *(long *)((long)pgVar13[lVar1].dims + lVar30 * 2);
                  }
                  *(long *)((long)_hi + lVar30 * 2) = lVar28;
                  iVar19 = iVar19 + *(int *)((long)pgVar13[lVar1].num_blocks + lVar30 * 2);
                  lVar30 = lVar30 + 4;
                } while ((uVar34 & 0xffffffff) << 2 != lVar30);
              }
            }
            else if (iVar19 == 0) {
              if (pgVar13[lVar1].num_rstrctd == 0) {
                if ((short)uVar3 < 1) {
                  lVar30 = 1;
                }
                else {
                  lVar30 = 1;
                  uVar26 = 0;
                  do {
                    lVar30 = lVar30 * pgVar13[g_a + 1000].nblock[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar34 != uVar26);
                }
                if ((IVar17 < 0) || (lVar30 <= IVar17)) {
LAB_0019007f:
                  if (0 < (short)uVar3) {
                    memset(err_string,0,uVar34 << 3);
LAB_001900ab:
                    memset(_hi,0xff,uVar34 << 3);
                  }
                }
                else if (0 < (short)uVar3) {
                  pCVar10 = pgVar13[lVar1].mapc;
                  lVar30 = 0;
                  uVar26 = 0;
                  IVar18 = IVar17;
                  do {
                    lVar24 = (long)pgVar13[g_a + 1000].nblock[uVar26];
                    lVar28 = IVar18 % lVar24;
                    width[uVar26 - 0x20] = pCVar10[lVar28 + lVar30];
                    if (lVar28 == lVar24 + -1) {
                      CVar29 = pgVar13[g_a + 1000].dims[uVar26];
                    }
                    else {
                      CVar29 = pCVar10[lVar28 + lVar30 + 1] + -1;
                    }
                    lVar30 = lVar30 + lVar24;
                    _hi[uVar26] = CVar29;
                    uVar26 = uVar26 + 1;
                    IVar18 = IVar18 / lVar24;
                  } while (uVar34 != uVar26);
                }
              }
              else if (IVar17 < pgVar13[lVar1].num_rstrctd) {
                if ((short)uVar3 < 1) {
                  lVar30 = 1;
                }
                else {
                  lVar30 = 1;
                  uVar26 = 0;
                  do {
                    lVar30 = lVar30 * pgVar13[g_a + 1000].nblock[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar34 != uVar26);
                }
                if ((IVar17 < 0) || (lVar30 <= IVar17)) goto LAB_0019007f;
                if (0 < (short)uVar3) {
                  pCVar10 = pgVar13[lVar1].mapc;
                  lVar30 = 0;
                  uVar26 = 0;
                  IVar18 = IVar17;
                  do {
                    lVar24 = (long)pgVar13[g_a + 1000].nblock[uVar26];
                    lVar28 = IVar18 % lVar24;
                    width[uVar26 - 0x20] = pCVar10[lVar28 + lVar30];
                    if (lVar28 == lVar24 + -1) {
                      CVar29 = pgVar13[g_a + 1000].dims[uVar26];
                    }
                    else {
                      CVar29 = pCVar10[lVar28 + lVar30 + 1] + -1;
                    }
                    lVar30 = lVar30 + lVar24;
                    _hi[uVar26] = CVar29;
                    uVar26 = uVar26 + 1;
                    IVar18 = IVar18 / lVar24;
                  } while (uVar34 != uVar26);
                }
              }
              else if (0 < (short)uVar3) {
                memset(err_string,0,(ulong)uVar3 << 3);
                goto LAB_001900ab;
              }
            }
            if (uVar34 == 1) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar13[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar28 = 1;
              lVar30 = 0;
            }
            else {
              lVar28 = 1;
              lVar24 = 0;
              lVar30 = 0;
              do {
                lVar30 = lVar30 + plo_rem[lVar24] * lVar28;
                lVar31 = (_hi[lVar24] - width[lVar24 + -0x20]) +
                         pgVar13[g_a + 1000].width[lVar24] * 2 + 1;
                ld_rem[lVar24] = lVar31;
                lVar28 = lVar28 * lVar31;
                lVar24 = lVar24 + 1;
              } while (uVar34 - 1 != lVar24);
            }
            lVar24 = plo_rem[uVar34 - 1];
            pcVar9 = ppcVar7[IVar17];
            stride_loc[0] = iVar4;
            stride_rem[0] = iVar4;
            if (sVar2 != 1) {
              lVar31 = 0;
              iVar19 = iVar4;
              iVar14 = iVar4;
              do {
                iVar19 = iVar19 * (int)ld_rem[lVar31];
                stride_rem[lVar31] = iVar19;
                iVar14 = iVar14 * (int)ld_loc[lVar31];
                stride_loc[lVar31] = iVar14;
                stride_rem[lVar31 + 1] = iVar19;
                stride_loc[lVar31 + 1] = iVar14;
                lVar31 = lVar31 + 1;
              } while (lVar22 != lVar31);
            }
            lVar31 = 0;
            do {
              count[lVar31] = ((int)phi_rem[lVar31] - (int)plo_rem[lVar31]) + 1;
              lVar31 = lVar31 + 1;
            } while (ndim != lVar31);
            count[0] = count[0] * iVar4;
            if (-1 < iVar5) {
              IVar17 = (Integer)PGRP_LIST[iVar5].inv_map_proc_list[IVar17];
            }
            ARMCI_PutS_flag(pcVar8 + (lVar23 * lVar27 + lVar33) * (long)iVar25,stride_loc,
                            pcVar9 + (lVar28 * lVar24 + lVar30) * (long)iVar25,stride_rem,count,
                            (int)lVar21,GA_Update_Flags[IVar17] + iVar32,*GA_Update_Signal,
                            (int)IVar17);
            get_remote_block_pos(idx,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
            lVar15 = pnga_locate_region(g_a,slo_rem,shi_rem,map,proclist,&np);
            if (lVar15 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar16 = strlen(err_string);
              sprintf(err_string + (int)sVar16," [%ld:%ld ",slo_rem[0],shi_rem[0]);
              sVar16 = strlen(err_string);
              iVar19 = (int)sVar16;
              IVar17 = pnga_ndim(g_a);
              if (1 < IVar17) {
                lVar33 = 1;
                do {
                  sprintf(err_string + (int)sVar16,",%ld:%ld ",slo_rem[lVar33],shi_rem[lVar33]);
                  sVar16 = strlen(err_string);
                  iVar19 = (int)sVar16;
                  lVar33 = lVar33 + 1;
                  IVar17 = pnga_ndim(g_a);
                } while (lVar33 < IVar17);
              }
              (err_string + iVar19)[0] = ']';
              (err_string + iVar19)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            IVar17 = *proclist;
            pnga_distribution(g_a,IVar17,tlo_rem,thi_rem);
            pgVar13 = GA;
            lVar33 = 0;
            do {
              if (increment[lVar33] == 0) {
                if (idx == lVar33) {
                  plo_rem[lVar33] = 0;
                  phi_rem[lVar33] = width[lVar33] + -1;
                  lVar23 = (width[lVar33] + -1 + hi_loc[lVar33]) - lo_loc[lVar33];
                }
                else {
                  lVar23 = width[lVar33];
                  plo_rem[lVar33] = lVar23;
                  phi_rem[lVar33] = (thi_rem[lVar33] + lVar23) - tlo_rem[lVar33];
                }
              }
              else {
                plo_rem[lVar33] = 0;
                phi_rem[lVar33] = (increment[lVar33] + thi_rem[lVar33]) - tlo_rem[lVar33];
                lVar23 = 0;
              }
              plo_loc[lVar33] = lVar23;
              lVar33 = lVar33 + 1;
            } while (ndim != lVar33);
            uVar3 = GA[lVar1].ndim;
            uVar34 = (ulong)(short)uVar3;
            iVar19 = GA[lVar1].distr_type;
            if (iVar19 - 1U < 3) {
              uVar26 = (long)(int)GAme % GA[lVar1].num_blocks[0];
              _index[0] = (int)uVar26;
              if (1 < (short)uVar3) {
                uVar26 = uVar26 & 0xffffffff;
                lVar33 = 0;
                IVar18 = GAme;
                do {
                  IVar18 = (long)((int)IVar18 - (int)uVar26) / GA[g_a + 1000].num_blocks[lVar33];
                  uVar26 = (long)(int)IVar18 % GA[g_a + 1000].num_blocks[lVar33 + 1];
                  _index[lVar33 + 1] = (int)uVar26;
                  lVar33 = lVar33 + 1;
                } while ((uVar34 & 0xffffffff) - 1 != lVar33);
              }
              if (0 < (short)uVar3) {
                lVar33 = 0;
                do {
                  iVar25 = *(int *)((long)_index + lVar33);
                  lVar23 = *(long *)((long)GA[g_a + 1000].block_dims + lVar33 * 2);
                  *(long *)(err_string + lVar33 * 2) = lVar23 * iVar25 + 1;
                  lVar23 = ((long)iVar25 + 1) * lVar23;
                  *(long *)((long)_hi + lVar33 * 2) = lVar23;
                  lVar27 = *(long *)((long)GA[g_a + 1000].dims + lVar33 * 2);
                  if (lVar27 <= lVar23) {
                    lVar23 = lVar27;
                  }
                  *(long *)((long)_hi + lVar33 * 2) = lVar23;
                  lVar33 = lVar33 + 4;
                } while ((uVar34 & 0xffffffff) << 2 != lVar33);
              }
            }
            else if (iVar19 == 4) {
              uVar26 = (long)(int)GAme % GA[lVar1].num_blocks[0];
              _index[0] = (int)uVar26;
              if (1 < (short)uVar3) {
                uVar26 = uVar26 & 0xffffffff;
                lVar33 = 0;
                IVar18 = GAme;
                do {
                  IVar18 = (long)((int)IVar18 - (int)uVar26) / GA[g_a + 1000].num_blocks[lVar33];
                  uVar26 = (long)(int)IVar18 % GA[g_a + 1000].num_blocks[lVar33 + 1];
                  _index[lVar33 + 1] = (int)uVar26;
                  lVar33 = lVar33 + 1;
                } while ((uVar34 & 0xffffffff) - 1 != lVar33);
              }
              if (0 < (short)uVar3) {
                pCVar10 = GA[lVar1].mapc;
                lVar33 = 0;
                iVar25 = 0;
                do {
                  iVar14 = *(int *)((long)_index + lVar33);
                  lVar23 = (long)iVar25 + (long)iVar14;
                  *(C_Integer *)(err_string + lVar33 * 2) = pCVar10[lVar23];
                  if ((long)iVar14 < *(long *)((long)GA[lVar1].num_blocks + lVar33 * 2) + -1) {
                    lVar23 = GA[lVar1].mapc[lVar23 + 1] + -1;
                  }
                  else {
                    lVar23 = *(long *)((long)GA[lVar1].dims + lVar33 * 2);
                  }
                  *(long *)((long)_hi + lVar33 * 2) = lVar23;
                  iVar25 = iVar25 + *(int *)((long)GA[lVar1].num_blocks + lVar33 * 2);
                  lVar33 = lVar33 + 4;
                } while ((uVar34 & 0xffffffff) << 2 != lVar33);
              }
            }
            else if (iVar19 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if ((short)uVar3 < 1) {
                  lVar33 = 1;
                }
                else {
                  lVar33 = 1;
                  uVar26 = 0;
                  do {
                    lVar33 = lVar33 * GA[g_a + 1000].nblock[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar34 != uVar26);
                }
                if (-1 < GAme && GAme < lVar33) {
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    lVar33 = 0;
                    uVar26 = 0;
                    IVar18 = GAme;
                    do {
                      lVar27 = (long)GA[g_a + 1000].nblock[uVar26];
                      lVar23 = IVar18 % lVar27;
                      width[uVar26 - 0x20] = pCVar10[lVar23 + lVar33];
                      if (lVar23 == lVar27 + -1) {
                        CVar29 = GA[g_a + 1000].dims[uVar26];
                      }
                      else {
                        CVar29 = pCVar10[lVar23 + lVar33 + 1] + -1;
                      }
                      lVar33 = lVar33 + lVar27;
                      _hi[uVar26] = CVar29;
                      uVar26 = uVar26 + 1;
                      IVar18 = IVar18 / lVar27;
                    } while (uVar34 != uVar26);
                  }
                  goto LAB_0019089d;
                }
              }
              else if (GAme < GA[lVar1].num_rstrctd) {
                if ((short)uVar3 < 1) {
                  lVar33 = 1;
                }
                else {
                  lVar33 = 1;
                  uVar26 = 0;
                  do {
                    lVar33 = lVar33 * GA[g_a + 1000].nblock[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar34 != uVar26);
                }
                if ((-1 < GAme) && (GAme < lVar33)) {
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    lVar33 = 0;
                    uVar26 = 0;
                    IVar18 = GAme;
                    do {
                      lVar27 = (long)GA[g_a + 1000].nblock[uVar26];
                      lVar23 = IVar18 % lVar27;
                      width[uVar26 - 0x20] = pCVar10[lVar23 + lVar33];
                      if (lVar23 == lVar27 + -1) {
                        CVar29 = GA[g_a + 1000].dims[uVar26];
                      }
                      else {
                        CVar29 = pCVar10[lVar23 + lVar33 + 1] + -1;
                      }
                      lVar33 = lVar33 + lVar27;
                      _hi[uVar26] = CVar29;
                      uVar26 = uVar26 + 1;
                      IVar18 = IVar18 / lVar27;
                    } while (uVar34 != uVar26);
                  }
                  goto LAB_0019089d;
                }
              }
              if (0 < (short)uVar3) {
                memset(err_string,0,uVar34 * 8);
                memset(_hi,0xff,uVar34 * 8);
              }
            }
LAB_0019089d:
            if (uVar34 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar13[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar23 = 1;
              lVar33 = 0;
            }
            else {
              lVar23 = 1;
              lVar33 = 0;
              lVar27 = 0;
              do {
                lVar33 = lVar33 + plo_loc[lVar27] * lVar23;
                lVar30 = (_hi[lVar27] - width[lVar27 + -0x20]) +
                         pgVar13[g_a + 1000].width[lVar27] * 2 + 1;
                ld_loc[lVar27] = lVar30;
                lVar23 = lVar23 * lVar30;
                lVar27 = lVar27 + 1;
              } while (uVar34 - 1 != lVar27);
            }
            lVar27 = plo_loc[uVar34 - 1];
            ppcVar7 = pgVar13[lVar1].ptr;
            iVar25 = pgVar13[lVar1].elemsize;
            pcVar8 = ppcVar7[GAme];
            local_630 = (int)IVar17;
            if (iVar19 - 1U < 3) {
              uVar26 = (long)local_630 % pgVar13[lVar1].num_blocks[0];
              _index[0] = (int)uVar26;
              if (1 < (short)uVar3) {
                uVar26 = uVar26 & 0xffffffff;
                lVar30 = 0;
                IVar18 = IVar17;
                do {
                  IVar18 = (long)((int)IVar18 - (int)uVar26) /
                           pgVar13[g_a + 1000].num_blocks[lVar30];
                  uVar26 = (long)(int)IVar18 % pgVar13[g_a + 1000].num_blocks[lVar30 + 1];
                  _index[lVar30 + 1] = (int)uVar26;
                  lVar30 = lVar30 + 1;
                } while ((uVar34 & 0xffffffff) - 1 != lVar30);
              }
              if (0 < (short)uVar3) {
                lVar30 = 0;
                do {
                  iVar19 = *(int *)((long)_index + lVar30);
                  lVar28 = *(long *)((long)pgVar13[g_a + 1000].block_dims + lVar30 * 2);
                  *(long *)(err_string + lVar30 * 2) = lVar28 * iVar19 + 1;
                  lVar28 = ((long)iVar19 + 1) * lVar28;
                  *(long *)((long)_hi + lVar30 * 2) = lVar28;
                  lVar24 = *(long *)((long)pgVar13[g_a + 1000].dims + lVar30 * 2);
                  if (lVar24 <= lVar28) {
                    lVar28 = lVar24;
                  }
                  *(long *)((long)_hi + lVar30 * 2) = lVar28;
                  lVar30 = lVar30 + 4;
                } while ((uVar34 & 0xffffffff) << 2 != lVar30);
              }
            }
            else if (iVar19 == 4) {
              uVar26 = (long)local_630 % pgVar13[lVar1].num_blocks[0];
              _index[0] = (int)uVar26;
              if (1 < (short)uVar3) {
                uVar26 = uVar26 & 0xffffffff;
                lVar30 = 0;
                IVar18 = IVar17;
                do {
                  IVar18 = (long)((int)IVar18 - (int)uVar26) /
                           pgVar13[g_a + 1000].num_blocks[lVar30];
                  uVar26 = (long)(int)IVar18 % pgVar13[g_a + 1000].num_blocks[lVar30 + 1];
                  _index[lVar30 + 1] = (int)uVar26;
                  lVar30 = lVar30 + 1;
                } while ((uVar34 & 0xffffffff) - 1 != lVar30);
              }
              if (0 < (short)uVar3) {
                pCVar10 = pgVar13[lVar1].mapc;
                lVar30 = 0;
                iVar19 = 0;
                do {
                  iVar14 = *(int *)((long)_index + lVar30);
                  lVar28 = (long)iVar19 + (long)iVar14;
                  *(C_Integer *)(err_string + lVar30 * 2) = pCVar10[lVar28];
                  if ((long)iVar14 < *(long *)((long)pgVar13[lVar1].num_blocks + lVar30 * 2) + -1) {
                    lVar28 = pgVar13[lVar1].mapc[lVar28 + 1] + -1;
                  }
                  else {
                    lVar28 = *(long *)((long)pgVar13[lVar1].dims + lVar30 * 2);
                  }
                  *(long *)((long)_hi + lVar30 * 2) = lVar28;
                  iVar19 = iVar19 + *(int *)((long)pgVar13[lVar1].num_blocks + lVar30 * 2);
                  lVar30 = lVar30 + 4;
                } while ((uVar34 & 0xffffffff) << 2 != lVar30);
              }
            }
            else if (iVar19 == 0) {
              if (pgVar13[lVar1].num_rstrctd == 0) {
                if ((short)uVar3 < 1) {
                  lVar30 = 1;
                }
                else {
                  lVar30 = 1;
                  uVar26 = 0;
                  do {
                    lVar30 = lVar30 * pgVar13[g_a + 1000].nblock[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar34 != uVar26);
                }
                if ((IVar17 < 0) || (lVar30 <= IVar17)) {
LAB_00190cda:
                  if (0 < (short)uVar3) {
                    memset(err_string,0,uVar34 << 3);
LAB_00190d06:
                    memset(_hi,0xff,uVar34 << 3);
                  }
                }
                else if (0 < (short)uVar3) {
                  pCVar10 = pgVar13[lVar1].mapc;
                  lVar30 = 0;
                  uVar26 = 0;
                  IVar18 = IVar17;
                  do {
                    lVar24 = (long)pgVar13[g_a + 1000].nblock[uVar26];
                    lVar28 = IVar18 % lVar24;
                    width[uVar26 - 0x20] = pCVar10[lVar28 + lVar30];
                    if (lVar28 == lVar24 + -1) {
                      CVar29 = pgVar13[g_a + 1000].dims[uVar26];
                    }
                    else {
                      CVar29 = pCVar10[lVar28 + lVar30 + 1] + -1;
                    }
                    lVar30 = lVar30 + lVar24;
                    _hi[uVar26] = CVar29;
                    uVar26 = uVar26 + 1;
                    IVar18 = IVar18 / lVar24;
                  } while (uVar34 != uVar26);
                }
              }
              else if (IVar17 < pgVar13[lVar1].num_rstrctd) {
                if ((short)uVar3 < 1) {
                  lVar30 = 1;
                }
                else {
                  lVar30 = 1;
                  uVar26 = 0;
                  do {
                    lVar30 = lVar30 * pgVar13[g_a + 1000].nblock[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar34 != uVar26);
                }
                if ((IVar17 < 0) || (lVar30 <= IVar17)) goto LAB_00190cda;
                if (0 < (short)uVar3) {
                  pCVar10 = pgVar13[lVar1].mapc;
                  lVar30 = 0;
                  uVar26 = 0;
                  IVar18 = IVar17;
                  do {
                    lVar24 = (long)pgVar13[g_a + 1000].nblock[uVar26];
                    lVar28 = IVar18 % lVar24;
                    width[uVar26 - 0x20] = pCVar10[lVar28 + lVar30];
                    if (lVar28 == lVar24 + -1) {
                      CVar29 = pgVar13[g_a + 1000].dims[uVar26];
                    }
                    else {
                      CVar29 = pCVar10[lVar28 + lVar30 + 1] + -1;
                    }
                    lVar30 = lVar30 + lVar24;
                    _hi[uVar26] = CVar29;
                    uVar26 = uVar26 + 1;
                    IVar18 = IVar18 / lVar24;
                  } while (uVar34 != uVar26);
                }
              }
              else if (0 < (short)uVar3) {
                memset(err_string,0,(ulong)uVar3 << 3);
                goto LAB_00190d06;
              }
            }
            if (uVar34 == 1) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar13[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar28 = 1;
              lVar30 = 0;
            }
            else {
              lVar28 = 1;
              lVar30 = 0;
              lVar24 = 0;
              do {
                lVar30 = lVar30 + plo_rem[lVar24] * lVar28;
                lVar31 = (_hi[lVar24] - width[lVar24 + -0x20]) +
                         pgVar13[g_a + 1000].width[lVar24] * 2 + 1;
                ld_rem[lVar24] = lVar31;
                lVar28 = lVar28 * lVar31;
                lVar24 = lVar24 + 1;
              } while (uVar34 - 1 != lVar24);
            }
            lVar24 = plo_rem[uVar34 - 1];
            pcVar9 = ppcVar7[IVar17];
            stride_loc[0] = iVar4;
            stride_rem[0] = iVar4;
            if (sVar2 != 1) {
              lVar31 = 0;
              iVar19 = iVar4;
              iVar14 = iVar4;
              do {
                iVar19 = iVar19 * (int)ld_rem[lVar31];
                stride_rem[lVar31] = iVar19;
                iVar14 = iVar14 * (int)ld_loc[lVar31];
                stride_loc[lVar31] = iVar14;
                stride_rem[lVar31 + 1] = iVar19;
                stride_loc[lVar31 + 1] = iVar14;
                lVar31 = lVar31 + 1;
              } while (lVar22 != lVar31);
            }
            lVar31 = 0;
            do {
              count[lVar31] = ((int)phi_rem[lVar31] - (int)plo_rem[lVar31]) + 1;
              lVar31 = lVar31 + 1;
            } while (ndim != lVar31);
            count[0] = count[0] * iVar4;
            if (-1 < iVar5) {
              IVar17 = (Integer)PGRP_LIST[iVar5].inv_map_proc_list[IVar17];
            }
            ARMCI_PutS_flag(pcVar8 + (lVar23 * lVar27 + lVar33) * (long)iVar25,stride_loc,
                            pcVar9 + (lVar28 * lVar24 + lVar30) * (long)iVar25,stride_rem,count,
                            (int)lVar21,GA_Update_Flags[IVar17] + (long)iVar32 + 1,*GA_Update_Signal
                            ,(int)IVar17);
            iVar32 = iVar32 + 2;
          }
          piVar11 = GA_Update_Flags[GAme];
          iVar19 = 1;
          while ((piVar11[(long)iVar32 + -2] == 0 || (piVar11[(long)iVar32 + -1] == 0))) {
            dVar12 = (double)iVar19;
            iVar19 = iVar19 + 1;
            exp(-dVar12);
          }
          increment[idx] = lVar6 * 2;
          idx = idx + 1;
        } while (idx != ndim);
      }
      if (0 < sVar2) {
        memset(GA_Update_Flags[GAme],0,ndim << 3);
      }
      free(map);
      free(proclist);
      lVar20 = 1;
    }
  }
  return lVar20;
}

Assistant:

logical pnga_update55_ghosts(Integer g_a)
{
  Integer idx, i, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer size, ndim, nwidth, increment[MAXDIM];
  Integer width[MAXDIM];
  Integer dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  int msgcnt;
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * This operation is implemented using put calls to place the
   * appropriate data on remote processors. To signal the remote
   * processor that it has received the data, a second put call
   * consisting of a single integer is sent after the first put call and
   * used to update a signal buffer on the remote processor. Each
   * processor can determine how much data it has received by checking
   * its signal buffer. 
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. 
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;

  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) return FALSE;
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update55_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update55_ghosts:malloc failed (_ga_proclist)",0);

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[GAme];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* loop over dimensions for sequential update using shift algorithm */
  msgcnt = 0;
  (*GA_Update_Signal) = 1;
  for (idx=0; idx < ndim; idx++) {
    nwidth = width[idx];

    /* Do not bother with update if nwidth is zero */
    if (nwidth != 0) {

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired location of remote
         data as well as the actual coordinates of the local chunk
         of data that will be sent to remote processor (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] + 1;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + 2*width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* Put local data on remote processor */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
#if 0
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count, ndim- 1, proc_rem);
      /* Send signal to remote processor that data transfer has been completed. */
      bytes = sizeof(int);
      ARMCI_Put(GA_Update_Signal, GA_Update_Flags[proc_rem]+msgcnt, bytes, proc_rem);
#else
      ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
          *GA_Update_Signal, (int)proc_rem);
#endif
      msgcnt++;

      /* Perform update in positive direction. */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired chunk of remote
         data as well as the actual coordinates of the local chunk
         of data that will receive the remote data (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = 0;
            phi_rem[i] = width[i] - 1;
            plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] - 1;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(GAme, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* Put local data on remote processor */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
#if 0
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count, ndim- 1, proc_rem);
      /* Send signal to remote processor that data transfer has been completed. */
      bytes = sizeof(int);
      ARMCI_Put(GA_Update_Signal, GA_Update_Flags[proc_rem]+msgcnt, bytes, proc_rem);

#else
      ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
          *GA_Update_Signal, (int)proc_rem);
#endif
      msgcnt++;
    }
    /* check to make sure that all messages have been recieved before
       starting update along new dimension */
    waitforflags((GA_Update_Flags[GAme]+msgcnt-2),
        (GA_Update_Flags[GAme]+msgcnt-1));
    /* update increment array */
    increment[idx] = 2*nwidth;
  }

  /* set GA_Update_Flags array to zero for next update operation. */
  for (idx=0; idx < 2*ndim; idx++) {
    GA_Update_Flags[GAme][idx] = 0;
  }

  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}